

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::lexer(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *this,input_adapter_t *adapter)

{
  char cVar1;
  int_type iVar2;
  input_adapter_t *adapter_local;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_local;
  
  std::shared_ptr<nlohmann::detail::input_adapter_protocol>::shared_ptr(&this->ia,adapter);
  iVar2 = std::char_traits<char>::eof();
  this->current = iVar2;
  this->next_unget = false;
  memset(&this->position,0,0x18);
  position_t::position_t(&this->position);
  memset(&this->token_string,0,0x18);
  std::vector<char,_std::allocator<char>_>::vector(&this->token_string);
  std::__cxx11::string::string((string *)&this->token_buffer);
  this->error_message = "";
  this->value_integer = 0;
  this->value_unsigned = 0;
  this->value_float = 0.0;
  cVar1 = get_decimal_point();
  this->decimal_point_char = cVar1;
  return;
}

Assistant:

explicit lexer(detail::input_adapter_t&& adapter)
        : ia(std::move(adapter)), decimal_point_char(get_decimal_point()) {}